

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::CombineAccessChains::GetConstantValue
          (CombineAccessChains *this,Constant *constant_inst)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*constant_inst->type_->_vptr_Type[10])();
  if (0x20 < *(uint *)(CONCAT44(extraout_var,iVar1) + 0x24)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/combine_access_chains.cpp"
                  ,0x47,
                  "uint32_t spvtools::opt::CombineAccessChains::GetConstantValue(const analysis::Constant *)"
                 );
  }
  iVar1 = (*constant_inst->type_->_vptr_Type[10])();
  if (*(char *)(CONCAT44(extraout_var_00,iVar1) + 0x28) == '\x01') {
    uVar2 = analysis::Constant::GetS32(constant_inst);
    return uVar2;
  }
  uVar2 = analysis::Constant::GetU32(constant_inst);
  return uVar2;
}

Assistant:

uint32_t CombineAccessChains::GetConstantValue(
    const analysis::Constant* constant_inst) {
  if (constant_inst->type()->AsInteger()->width() <= 32) {
    if (constant_inst->type()->AsInteger()->IsSigned()) {
      return static_cast<uint32_t>(constant_inst->GetS32());
    } else {
      return constant_inst->GetU32();
    }
  } else {
    assert(false);
    return 0u;
  }
}